

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O0

bool uuids::uuid::is_valid_uuid<wchar_t[37]>(wchar_t (*in_str) [37])

{
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  wchar_t *pwVar5;
  ulong local_48;
  size_t i;
  size_t index;
  size_t hasBraces;
  undefined1 auStack_28 [7];
  bool firstDigit;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> str;
  wchar_t (*in_str_local) [37];
  
  str._M_str = *in_str;
  _auStack_28 = detail::to_string_view<wchar_t>(*in_str);
  bVar1 = true;
  i = 0;
  bVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28);
  if (bVar2) {
    in_str_local._7_1_ = false;
  }
  else {
    pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::front
                       ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28);
    index = (size_t)(*pvVar3 == 0x7b);
    if ((index == 0) ||
       (pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::back
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28),
       *pvVar3 == 0x7d)) {
      for (local_48 = index;
          sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28),
          local_48 < sVar4 - index; local_48 = local_48 + 1) {
        pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                           ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,
                            local_48);
        if (*pvVar3 != 0x2d) {
          if (0xf < i) {
            return false;
          }
          pwVar5 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                             ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_28,
                              local_48);
          bVar2 = detail::is_hex<wchar_t>(*pwVar5);
          if (!bVar2) {
            return false;
          }
          bVar1 = !bVar1;
          if (bVar1) {
            i = i + 1;
          }
        }
      }
      if (i < 0x10) {
        in_str_local._7_1_ = false;
      }
      else {
        in_str_local._7_1_ = true;
      }
    }
    else {
      in_str_local._7_1_ = false;
    }
  }
  return in_str_local._7_1_;
}

Assistant:

[[nodiscard]] constexpr static bool is_valid_uuid(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         if (str.empty())
            return false;

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return false;

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return false;
            }

            if (firstDigit)
            {
               firstDigit = false;
            }
            else
            {
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return false;
         }

         return true;
      }